

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_extra.c
# Opt level: O3

char * nsync_time_str(nsync_time t,int decimals)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  double dVar4;
  
  dVar4 = (double)t.tv_nsec * 1e-09 + (double)t.tv_sec;
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x50) break;
    lVar1 = lVar3 + 0x10;
  } while (*(double *)((long)&nsync_time_str::scale[1].multiplier + lVar3) <= dVar4);
  pcVar2 = smprintf("%.*f%s",dVar4 / *(double *)((long)&nsync_time_str::scale[0].multiplier + lVar3)
                    ,(ulong)(uint)decimals,
                    *(undefined8 *)((long)&nsync_time_str::scale[0].suffix + lVar3));
  return pcVar2;
}

Assistant:

NSYNC_CPP_USING_

char *nsync_time_str (nsync_time t, int decimals) {
	static const struct {
		const char *suffix;
		double multiplier;
	} scale[] = {
		{ "ns", 1.0e-9, },
		{ "us", 1e-6, },
		{ "ms", 1e-3, },
		{ "s", 1.0, },
		{ "hr", 3600.0, },
	};
        double s = nsync_time_to_dbl (t);
	int i = 0;
	while (i + 1 != sizeof (scale) / sizeof (scale[0]) && scale[i + 1].multiplier <= s) {
		i++;
	}
	return (smprintf ("%.*f%s", decimals, s/scale[i].multiplier, scale[i].suffix));
}